

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::clipToEffectiveMask(QWidgetPrivate *this,QRegion *region)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QRegion local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar3 = lVar1;
  if (this->graphicsEffect == (QGraphicsEffect *)0x0) {
LAB_002faee3:
    if (lVar3 == 0) goto LAB_002faf5a;
  }
  else if ((*(byte *)(*(long *)(lVar1 + 0x20) + 0xc) & 1) == 0) {
    lVar3 = *(long *)(*(long *)(lVar1 + 8) + 0x10);
    goto LAB_002faee3;
  }
  do {
    lVar2 = *(long *)(*(long *)(lVar3 + 8) + 0x78);
    if ((lVar2 != 0) && ((*(byte *)(lVar2 + 0x7c) & 0x80) != 0)) {
      if (lVar3 == lVar1) {
        QRegion::QRegion(&local_40,(QRegion *)(lVar2 + 0x40));
      }
      else {
        QRegion::translated((int)&local_40,(int)(QRegion *)(lVar2 + 0x40));
      }
      QRegion::operator&=(region,&local_40);
      QRegion::~QRegion(&local_40);
    }
  } while (((*(byte *)(*(long *)(lVar3 + 0x20) + 0xc) & 1) == 0) &&
          (lVar3 = *(long *)(*(long *)(lVar3 + 8) + 0x10), lVar3 != 0));
LAB_002faf5a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::clipToEffectiveMask(QRegion &region) const
{
    Q_Q(const QWidget);

    const QWidget *w = q;
    QPoint offset;

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect && !w->isWindow()) {
        w = q->parentWidget();
        offset -= data.crect.topLeft();
    }
#endif // QT_CONFIG(graphicseffect)

    while (w) {
        const QWidgetPrivate *wd = w->d_func();
        if (wd->extra && wd->extra->hasMask)
            region &= (w != q) ? wd->extra->mask.translated(offset) : wd->extra->mask;
        if (w->isWindow())
            return;
        offset -= wd->data.crect.topLeft();
        w = w->parentWidget();
    }
}